

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool httplib::detail::read_content<httplib::Response>
               (Stream *strm,Response *x,size_t payload_max_length,int *status,Progress *progress,
               ContentReceiverWithProgress *receiver,bool decompress)

{
  _Manager_type p_Var1;
  ContentReceiverWithProgress receiver_00;
  anon_class_40_5_1ac14285 callback;
  bool bVar2;
  undefined8 in_stack_ffffffffffffff90;
  size_t local_40;
  size_t payload_max_length_local;
  undefined8 uStack_30;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  payload_max_length_local = 0;
  uStack_30 = 0;
  local_28 = (_Manager_type)0x0;
  local_20 = receiver->_M_invoker;
  p_Var1 = (receiver->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    payload_max_length_local = *(size_t *)&(receiver->super__Function_base)._M_functor;
    uStack_30 = *(undefined8 *)((long)&(receiver->super__Function_base)._M_functor + 8);
    (receiver->super__Function_base)._M_manager = (_Manager_type)0x0;
    receiver->_M_invoker = (_Invoker_type)0x0;
    local_28 = p_Var1;
  }
  receiver_00.super__Function_base._M_functor._8_8_ = strm;
  receiver_00.super__Function_base._M_functor._M_unused._M_object = x;
  receiver_00.super__Function_base._M_manager = (_Manager_type)&local_40;
  receiver_00._M_invoker = (_Invoker_type)progress;
  callback.strm = (Stream *)in_stack_ffffffffffffff90;
  callback.x = (Response *)status;
  callback.payload_max_length = (size_t *)x;
  callback.progress = (Progress *)strm;
  callback.status = (int *)&local_40;
  local_40 = payload_max_length;
  bVar2 = prepare_content_receiver<httplib::Response,httplib::detail::read_content<httplib::Response>(httplib::Stream&,httplib::Response&,unsigned_long,int&,std::function<bool(unsigned_long,unsigned_long)>,std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>,bool)::_lambda(std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>const&)_1_>
                    (x,status,receiver_00,SUB81(&payload_max_length_local,0),callback);
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)((_Any_data *)&payload_max_length_local,(_Any_data *)&payload_max_length_local,
                __destroy_functor);
  }
  return bVar2;
}

Assistant:

bool read_content(Stream& strm, T& x, size_t payload_max_length, int& status,
            Progress progress, ContentReceiverWithProgress receiver,
            bool decompress) {
            return prepare_content_receiver(
                x, status, std::move(receiver), decompress,
                [&](const ContentReceiverWithProgress& out) {
                auto ret = true;
                auto exceed_payload_max_length = false;

                if (is_chunked_transfer_encoding(x.headers)) {
                    ret = read_content_chunked(strm, out);
                } else if (!has_header(x.headers, "Content-Length")) {
                    ret = read_content_without_length(strm, out);
                } else {
                    auto len = get_header_value<uint64_t>(x.headers, "Content-Length");
                    if (len > payload_max_length) {
                        exceed_payload_max_length = true;
                        skip_content_with_length(strm, len);
                        ret = false;
                    } else if (len > 0) {
                        ret = read_content_with_length(strm, len, std::move(progress), out);
                    }
                }

                if (!ret) { status = exceed_payload_max_length ? 413 : 400; }
                return ret;
            });
        }